

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O0

void __thiscall
InfoRecordDouble::InfoRecordDouble
          (InfoRecordDouble *this,string *Xname,string *Xdescription,bool Xadvanced,
          double *Xvalue_pointer,double Xdefault_value)

{
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  string local_70 [23];
  undefined1 in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  HighsInfoType in_stack_ffffffffffffffbc;
  InfoRecord *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  std::__cxx11::string::string(local_70,in_RDX);
  InfoRecord::InfoRecord
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *in_RDI = &PTR__InfoRecordDouble_0096dc08;
  in_RDI[0xb] = in_R8;
  in_RDI[0xc] = in_XMM0_Qa;
  *(undefined8 *)in_RDI[0xb] = in_RDI[0xc];
  return;
}

Assistant:

InfoRecordDouble(std::string Xname, std::string Xdescription, bool Xadvanced,
                   double* Xvalue_pointer, double Xdefault_value)
      : InfoRecord(HighsInfoType::kDouble, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    default_value = Xdefault_value;
    *value = default_value;
  }